

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# btAlignedObjectArray.h
# Opt level: O1

void __thiscall
btAlignedObjectArray<btMultiBodyConstraint_*>::
quickSortInternal<btSortMultiBodyConstraintOnIslandPredicate>
          (btAlignedObjectArray<btMultiBodyConstraint_*> *this,
          btSortMultiBodyConstraintOnIslandPredicate *CompareFunc,int lo,int hi)

{
  btMultiBodyConstraint *pbVar1;
  btMultiBodyConstraint *pbVar2;
  btMultiBodyConstraint **ppbVar3;
  int iVar4;
  int iVar5;
  int iVar6;
  int hi_00;
  long lVar7;
  long lVar8;
  int iVar9;
  
  do {
    pbVar1 = this->m_data[(hi + lo) / 2];
    iVar9 = lo;
    hi_00 = hi;
    do {
      lVar7 = (long)iVar9 + -1;
      iVar4 = iVar9;
      do {
        iVar9 = iVar4;
        pbVar2 = this->m_data[lVar7 + 1];
        iVar4 = (*pbVar1->_vptr_btMultiBodyConstraint[3])(pbVar1);
        iVar5 = (*pbVar1->_vptr_btMultiBodyConstraint[4])(pbVar1);
        if (-1 < iVar4) {
          iVar5 = iVar4;
        }
        iVar4 = (*pbVar2->_vptr_btMultiBodyConstraint[3])(pbVar2);
        iVar6 = (*pbVar2->_vptr_btMultiBodyConstraint[4])(pbVar2);
        if (-1 < iVar4) {
          iVar6 = iVar4;
        }
        lVar7 = lVar7 + 1;
        iVar4 = iVar9 + 1;
      } while (iVar6 < iVar5);
      lVar8 = (long)hi_00 + 1;
      iVar4 = hi_00;
      do {
        hi_00 = iVar4;
        pbVar2 = this->m_data[lVar8 + -1];
        iVar4 = (*pbVar2->_vptr_btMultiBodyConstraint[3])(pbVar2);
        iVar5 = (*pbVar2->_vptr_btMultiBodyConstraint[4])(pbVar2);
        if (-1 < iVar4) {
          iVar5 = iVar4;
        }
        iVar4 = (*pbVar1->_vptr_btMultiBodyConstraint[3])(pbVar1);
        iVar6 = (*pbVar1->_vptr_btMultiBodyConstraint[4])(pbVar1);
        if (-1 < iVar4) {
          iVar6 = iVar4;
        }
        lVar8 = lVar8 + -1;
        iVar4 = hi_00 + -1;
      } while (iVar6 < iVar5);
      if (lVar7 <= lVar8) {
        ppbVar3 = this->m_data;
        pbVar2 = ppbVar3[lVar7];
        ppbVar3[lVar7] = ppbVar3[lVar8];
        this->m_data[lVar8] = pbVar2;
        iVar9 = iVar9 + 1;
        hi_00 = hi_00 + -1;
      }
    } while (iVar9 <= hi_00);
    if (lo < hi_00) {
      quickSortInternal<btSortMultiBodyConstraintOnIslandPredicate>(this,CompareFunc,lo,hi_00);
    }
    lo = iVar9;
  } while (iVar9 < hi);
  return;
}

Assistant:

void quickSortInternal(const L& CompareFunc,int lo, int hi)
		{
		//  lo is the lower index, hi is the upper index
		//  of the region of array a that is to be sorted
			int i=lo, j=hi;
			T x=m_data[(lo+hi)/2];

			//  partition
			do
			{    
				while (CompareFunc(m_data[i],x)) 
					i++; 
				while (CompareFunc(x,m_data[j])) 
					j--;
				if (i<=j)
				{
					swap(i,j);
					i++; j--;
				}
			} while (i<=j);

			//  recursion
			if (lo<j) 
				quickSortInternal( CompareFunc, lo, j);
			if (i<hi) 
				quickSortInternal( CompareFunc, i, hi);
		}